

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  ImGuiContext *pIVar1;
  ImGuiWindowStackData *pIVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindow *window_00;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  if ((1 < (GImGui->CurrentWindowStack).Size) ||
     ((GImGui->WithinFrameScopeWithImplicitWindow & 1U) == 0)) {
    if ((window_00->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
      EndColumns();
    }
    PopClipRect();
    PopFocusScope();
    if ((window_00->Flags & 0x1000000U) == 0) {
      LogFinish();
    }
    if (((window_00->DC).IsSetPos & 1U) != 0) {
      ErrorCheckUsingSetCursorPosToExtendParentBoundaries();
    }
    pIVar2 = ImVector<ImGuiWindowStackData>::back(&pIVar1->CurrentWindowStack);
    memcpy(&pIVar1->LastItemData,&pIVar2->ParentLastItemDataBackup,0x3c);
    if ((window_00->Flags & 0x10000000U) != 0) {
      pIVar1->BeginMenuCount = pIVar1->BeginMenuCount + -1;
    }
    if ((window_00->Flags & 0x4000000U) != 0) {
      ImVector<ImGuiPopupData>::pop_back(&pIVar1->BeginPopupStack);
    }
    pIVar2 = ImVector<ImGuiWindowStackData>::back(&pIVar1->CurrentWindowStack);
    ImGuiStackSizes::CompareWithCurrentState(&pIVar2->StackSizesOnBegin);
    ImVector<ImGuiWindowStackData>::pop_back(&pIVar1->CurrentWindowStack);
    if ((pIVar1->CurrentWindowStack).Size != 0) {
      ImVector<ImGuiWindowStackData>::back(&pIVar1->CurrentWindowStack);
    }
    SetCurrentWindow(window_00);
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle
    PopFocusScope();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        g.BeginMenuCount--;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
}